

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

int formparse(OperationConfig *config,char *input,curl_mime **mimepost,curl_mime **mimecurrent,
             _Bool literal_value)

{
  char *__s1;
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CURLcode CVar6;
  curl_mime *pcVar7;
  char *pcVar8;
  curl_mimepart *part;
  char *pcVar9;
  undefined7 in_register_00000081;
  char *local_78;
  curl_slist *headers;
  curl_mime **local_68;
  char *type;
  char *data;
  char *contp;
  char *encoder;
  char *local_40;
  char *filename;
  
  iVar5 = (int)CONCAT71(in_register_00000081,literal_value);
  type = (char *)0x0;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  headers = (curl_slist *)0x0;
  if (*mimepost == (curl_mime *)0x0) {
    pcVar7 = (curl_mime *)curl_mime_init(config->easy);
    *mimepost = pcVar7;
    if (pcVar7 == (curl_mime *)0x0) {
      warnf(config->global,"curl_mime_init failed!\n");
      return 1;
    }
    *mimecurrent = pcVar7;
  }
  local_78 = strdup(input);
  if (local_78 == (char *)0x0) {
    curl_mfprintf(config->global->errors,"out of memory\n");
    return 2;
  }
  pcVar8 = strchr(local_78,0x3d);
  if (pcVar8 == (char *)0x0) {
    contp = pcVar8;
    warnf(config->global,"Illegally formatted input field!\n");
    free(local_78);
    return 0x20;
  }
  pcVar9 = (char *)0x0;
  if (local_78 < pcVar8) {
    pcVar9 = local_78;
  }
  __s1 = pcVar8 + 1;
  *pcVar8 = '\0';
  cVar1 = pcVar8[1];
  local_68 = mimecurrent;
  contp = __s1;
  if (cVar1 == '(' && !literal_value) {
    part = (curl_mimepart *)0x0;
    iVar3 = get_param_part(config,'\0',&contp,&data,&type,(char **)0x0,(char **)0x0,&headers);
    if (iVar3 < 0) {
      iVar5 = 3;
LAB_0010ded1:
      free(local_78);
      local_78 = (char *)0x0;
      bVar2 = false;
    }
    else {
      pcVar7 = (curl_mime *)curl_mime_init(config->easy);
      if (pcVar7 == (curl_mime *)0x0) {
        part = (curl_mimepart *)0x0;
        warnf(config->global,"curl_mime_init failed!\n");
        curl_slist_free_all(headers);
        iVar5 = 4;
        goto LAB_0010ded1;
      }
      part = (curl_mimepart *)curl_mime_addpart(*local_68);
      if (part == (curl_mimepart *)0x0) {
        part = (curl_mimepart *)0x0;
        warnf(config->global,"curl_mime_addpart failed!\n");
        curl_mime_free(pcVar7);
        curl_slist_free_all(headers);
        iVar5 = 5;
        goto LAB_0010ded1;
      }
      iVar3 = curl_mime_subparts(part,pcVar7);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_subparts failed!\n");
        curl_mime_free(pcVar7);
        curl_slist_free_all(headers);
        iVar5 = 6;
        goto LAB_0010ded1;
      }
      *local_68 = pcVar7;
      iVar3 = curl_mime_headers(part,headers,1);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        iVar5 = 7;
        goto LAB_0010ded1;
      }
      iVar3 = curl_mime_type(part,type);
      if (iVar3 != 0) {
        warnf(config->global,"curl_mime_type failed!\n");
        iVar5 = 8;
        goto LAB_0010ded1;
      }
      bVar2 = true;
    }
    if (!bVar2) {
LAB_0010df94:
      bVar2 = false;
      goto LAB_0010df9a;
    }
LAB_0010df58:
    bVar2 = true;
    if ((pcVar9 == (char *)0x0) || (iVar3 = curl_mime_name(part), iVar3 == 0)) goto LAB_0010df9a;
    warnf(config->global,"curl_mime_name failed!\n");
    iVar5 = 0x1f;
  }
  else {
    local_40 = pcVar9;
    if ((pcVar9 == (char *)0x0) && (iVar3 = strcmp(__s1,")"), iVar3 == 0 && !literal_value)) {
      if (*local_68 == *mimepost) {
        warnf(config->global,"no multipart to terminate!\n");
        iVar5 = 9;
        goto LAB_0010df85;
      }
      *local_68 = (*local_68)->parent->parent;
      part = (curl_mimepart *)0x0;
      pcVar9 = local_40;
      goto LAB_0010df58;
    }
    if (cVar1 == '@' && !literal_value) {
      part = (curl_mimepart *)0x0;
      pcVar7 = (curl_mime *)0x0;
      do {
        contp = contp + 1;
        iVar5 = get_param_part(config,',',&contp,&data,&type,&filename,&encoder,&headers);
        if (iVar5 < 0) {
          iVar5 = 10;
          goto LAB_0010df2a;
        }
        if (pcVar7 == (curl_mime *)0x0) {
          if (iVar5 == 0x2c) {
            pcVar7 = (curl_mime *)curl_mime_init(config->easy);
            if (pcVar7 == (curl_mime *)0x0) {
              warnf(config->global,"curl_mime_init failed!\n");
              curl_slist_free_all(headers);
              iVar5 = 0xb;
              goto LAB_0010df3c;
            }
          }
          else {
            pcVar7 = *local_68;
          }
        }
        part = (curl_mimepart *)curl_mime_addpart(pcVar7);
        if (part == (curl_mimepart *)0x0) {
          warnf(config->global,"curl_mime_addpart failed!\n");
          if (pcVar7 != *local_68) {
            curl_mime_free(pcVar7);
          }
          curl_slist_free_all(headers);
          iVar5 = 0xc;
          part = (curl_mimepart *)0x0;
          goto LAB_0010df3c;
        }
        iVar3 = curl_mime_headers(part,headers,1);
        pcVar8 = data;
        if (iVar3 != 0) {
          warnf(config->global,"curl_mime_headers failed!\n");
          if (pcVar7 != *local_68) {
            curl_mime_free(pcVar7);
          }
          curl_slist_free_all(headers);
          iVar5 = 0xd;
          goto LAB_0010df3c;
        }
        CVar6 = file_or_stdin(part,data);
        if ((CVar6 != CURLE_OK) &&
           (warnf(config->global,"setting file %s  failed!\n",pcVar8), CVar6 != CURLE_READ_ERROR)) {
          iVar5 = 0xe;
          if (pcVar7 != *local_68) {
            curl_mime_free(pcVar7);
          }
          goto LAB_0010df3c;
        }
        if ((filename != (char *)0x0) && (iVar3 = curl_mime_filename(part), iVar3 != 0)) {
          warnf(config->global,"curl_mime_filename failed!\n");
          iVar5 = 0xf;
LAB_0010df2a:
          if (pcVar7 != *local_68) {
            curl_mime_free(pcVar7);
          }
          goto LAB_0010df3c;
        }
        iVar3 = curl_mime_type(part,type);
        if (iVar3 != 0) {
          warnf(config->global,"curl_mime_type failed!\n");
          iVar5 = 0x10;
          goto LAB_0010df2a;
        }
        iVar3 = curl_mime_encoder(part,encoder);
        if (iVar3 != 0) {
          warnf(config->global,"curl_mime_encoder failed!\n");
          iVar5 = 0x11;
          goto LAB_0010df2a;
        }
      } while (iVar5 != 0);
      bVar2 = true;
      if (pcVar7 == *local_68) {
LAB_0010dff5:
        iVar5 = 0;
      }
      else {
        part = (curl_mimepart *)curl_mime_addpart();
        if (part == (curl_mimepart *)0x0) {
          part = (curl_mimepart *)0x0;
          warnf(config->global,"curl_mime_addpart failed!\n");
          curl_mime_free(pcVar7);
          iVar5 = 0x12;
        }
        else {
          iVar5 = curl_mime_subparts(part,pcVar7);
          if (iVar5 == 0) goto LAB_0010dff5;
          warnf(config->global,"curl_mime_subparts failed!\n");
          curl_mime_free(pcVar7);
          iVar5 = 0x13;
        }
LAB_0010df3c:
        free(local_78);
        local_78 = (char *)0x0;
        bVar2 = false;
      }
      pcVar9 = local_40;
      if (bVar2) goto LAB_0010df58;
      goto LAB_0010df94;
    }
    part = (curl_mimepart *)curl_mime_addpart(*local_68);
    if (part == (curl_mimepart *)0x0) {
      warnf(config->global,"curl_mime_addpart failed!\n");
      iVar5 = 0x14;
    }
    else {
      iVar3 = iVar5;
      if (*__s1 == '<' && !literal_value) {
        contp = pcVar8 + 2;
        iVar4 = get_param_part(config,'\0',&contp,&data,&type,(char **)0x0,&encoder,&headers);
        if (iVar4 < 0) {
          iVar5 = 0x15;
        }
        else {
          iVar5 = curl_mime_headers(part,headers,1);
          pcVar8 = data;
          if (iVar5 == 0) {
            CVar6 = file_or_stdin(part,data);
            if (CVar6 != CURLE_OK) {
              warnf(config->global,"setting file %s failed!\n",pcVar8);
              iVar5 = 0x17;
              iVar3 = 0x17;
              if (CVar6 != CURLE_READ_ERROR) goto LAB_0010df85;
            }
LAB_0010e035:
            iVar5 = iVar3;
            iVar3 = curl_mime_filename(part,filename);
            if (iVar3 == 0) {
              iVar3 = curl_mime_type(part,type);
              if (iVar3 == 0) {
                iVar3 = curl_mime_encoder(part,encoder);
                if (iVar3 == 0) {
                  pcVar9 = local_40;
                  if (iVar4 != 0) {
                    *contp = (char)iVar4;
                    warnf(config->global,"garbage at end of field specification: %s\n");
                    pcVar9 = local_40;
                  }
                  goto LAB_0010df58;
                }
                warnf(config->global,"curl_mime_encoder failed!\n");
                iVar5 = 0x1e;
              }
              else {
                warnf(config->global,"curl_mime_type failed!\n");
                iVar5 = 0x1d;
              }
            }
            else {
              warnf(config->global,"curl_mime_filename failed!\n");
              iVar5 = 0x1c;
            }
          }
          else {
            warnf(config->global,"curl_mime_headers failed!\n");
            curl_slist_free_all(headers);
            iVar5 = 0x16;
          }
        }
      }
      else {
        if (literal_value) {
          iVar4 = 0;
          data = __s1;
        }
        else {
          iVar4 = get_param_part(config,'\0',&contp,&data,&type,&filename,&encoder,&headers);
          if (iVar4 < 0) {
            iVar5 = 0x18;
            goto LAB_0010df85;
          }
        }
        iVar5 = curl_mime_headers(part,headers,1);
        if (iVar5 == 0) {
          iVar5 = curl_mime_data(part,data,0xffffffffffffffff);
          if (iVar5 == 0) goto LAB_0010e035;
          warnf(config->global,"curl_mime_data failed!\n");
          iVar5 = 0x1b;
        }
        else {
          warnf(config->global,"curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          iVar5 = 0x19;
        }
      }
    }
  }
LAB_0010df85:
  free(local_78);
  local_78 = (char *)0x0;
  bVar2 = false;
LAB_0010df9a:
  if (bVar2) {
    free(local_78);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int formparse(struct OperationConfig *config,
              const char *input,
              curl_mime **mimepost,
              curl_mime **mimecurrent,
              bool literal_value)
{
  /* input MUST be a string in the format 'name=contents' and we'll
     build a linked list with the info */
  char *name = NULL;
  char *contents = NULL;
  char *contp;
  char *data;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  struct curl_slist *headers = NULL;
  curl_mimepart *part = NULL;
  CURLcode res;

  /* Allocate the main mime structure if needed. */
  if(!*mimepost) {
    *mimepost = curl_mime_init(config->easy);
    if(!*mimepost) {
      warnf(config->global, "curl_mime_init failed!\n");
      return 1;
    }
    *mimecurrent = *mimepost;
  }

  /* Make a copy we can overwrite. */
  contents = strdup(input);
  if(!contents) {
    fprintf(config->global->errors, "out of memory\n");
    return 2;
  }

  /* Scan for the end of the name. */
  contp = strchr(contents, '=');
  if(contp) {
    int sep = '\0';
    if(contp > contents)
      name = contents;
    *contp++ = '\0';

    if(*contp == '(' && !literal_value) {
      curl_mime *subparts;

      /* Starting a multipart. */
      sep = get_param_part(config, '\0',
                           &contp, &data, &type, NULL, NULL, &headers);
      if(sep < 0) {
        Curl_safefree(contents);
        return 3;
      }
      subparts = curl_mime_init(config->easy);
      if(!subparts) {
        warnf(config->global, "curl_mime_init failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 4;
      }
      part = curl_mime_addpart(*mimecurrent);
      if(!part) {
        warnf(config->global, "curl_mime_addpart failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 5;
      }
      if(curl_mime_subparts(part, subparts)) {
        warnf(config->global, "curl_mime_subparts failed!\n");
        curl_mime_free(subparts);
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 6;
      }
      *mimecurrent = subparts;
      if(curl_mime_headers(part, headers, 1)) {
        warnf(config->global, "curl_mime_headers failed!\n");
        curl_slist_free_all(headers);
        Curl_safefree(contents);
        return 7;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 8;
      }
    }
    else if(!name && !strcmp(contp, ")") && !literal_value) {
      /* Ending a mutipart. */
      if(*mimecurrent == *mimepost) {
        warnf(config->global, "no multipart to terminate!\n");
        Curl_safefree(contents);
        return 9;
        }
      *mimecurrent = (*mimecurrent)->parent->parent;
    }
    else if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate file name(s) */

      curl_mime *subparts = NULL;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        ++contp;
        sep = get_param_part(config, ',', &contp,
                             &data, &type, &filename, &encoder, &headers);
        if(sep < 0) {
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 10;
        }

        /* now contp point to comma or string end.
           If more files to come, make sure we have multiparts. */
        if(!subparts) {
          if(sep != ',')    /* If there is a single file. */
            subparts = *mimecurrent;
          else {
            subparts = curl_mime_init(config->easy);
            if(!subparts) {
              warnf(config->global, "curl_mime_init failed!\n");
              curl_slist_free_all(headers);
              Curl_safefree(contents);
              return 11;
            }
          }
        }

        /* Allocate a part for that file. */
        part = curl_mime_addpart(subparts);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 12;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 13;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s  failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            if(subparts != *mimecurrent)
              curl_mime_free(subparts);
            Curl_safefree(contents);
            return 14;
          }
        }
        if(filename && curl_mime_filename(part, filename)) {
          warnf(config->global, "curl_mime_filename failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 15;
        }
        if(curl_mime_type(part, type)) {
          warnf(config->global, "curl_mime_type failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 16;
        }
        if(curl_mime_encoder(part, encoder)) {
          warnf(config->global, "curl_mime_encoder failed!\n");
          if(subparts != *mimecurrent)
            curl_mime_free(subparts);
          Curl_safefree(contents);
          return 17;
        }

        /* *contp could be '\0', so we just check with the delimiter */
      } while(sep); /* loop if there's another file name */

      /* now we add the multiple files section */
      if(subparts != *mimecurrent) {
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 18;
        }
        if(curl_mime_subparts(part, subparts)) {
          warnf(config->global, "curl_mime_subparts failed!\n");
          curl_mime_free(subparts);
          Curl_safefree(contents);
          return 19;
        }
      }
    }
    else {
        /* Allocate a mime part. */
        part = curl_mime_addpart(*mimecurrent);
        if(!part) {
          warnf(config->global, "curl_mime_addpart failed!\n");
          Curl_safefree(contents);
          return 20;
        }

      if(*contp == '<' && !literal_value) {
        ++contp;
        sep = get_param_part(config, '\0', &contp,
                             &data, &type, NULL, &encoder, &headers);
        if(sep < 0) {
          Curl_safefree(contents);
          return 21;
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 22;
        }

        /* Setup file in part. */
        res = file_or_stdin(part, data);
        if(res) {
          warnf(config->global, "setting file %s failed!\n", data);
          if(res != CURLE_READ_ERROR) {
            Curl_safefree(contents);
            return 23;
          }
        }
      }
      else {
        if(literal_value)
          data = contp;
        else {
          sep = get_param_part(config, '\0', &contp,
                               &data, &type, &filename, &encoder, &headers);
          if(sep < 0) {
            Curl_safefree(contents);
            return 24;
          }
        }

        /* Set part headers. */
        if(curl_mime_headers(part, headers, 1)) {
          warnf(config->global, "curl_mime_headers failed!\n");
          curl_slist_free_all(headers);
          Curl_safefree(contents);
          return 25;
        }

#ifdef CURL_DOES_CONVERSIONS
        if(convert_to_network(data, strlen(data))) {
          warnf(config->global, "curl_formadd failed!\n");
          Curl_safefree(contents);
          return 26;
        }
#endif

        if(curl_mime_data(part, data, CURL_ZERO_TERMINATED)) {
          warnf(config->global, "curl_mime_data failed!\n");
          Curl_safefree(contents);
          return 27;
        }
      }

      if(curl_mime_filename(part, filename)) {
        warnf(config->global, "curl_mime_filename failed!\n");
        Curl_safefree(contents);
        return 28;
      }
      if(curl_mime_type(part, type)) {
        warnf(config->global, "curl_mime_type failed!\n");
        Curl_safefree(contents);
        return 29;
      }
      if(curl_mime_encoder(part, encoder)) {
        warnf(config->global, "curl_mime_encoder failed!\n");
        Curl_safefree(contents);
        return 30;
      }

      if(sep) {
        *contp = (char) sep;
        warnf(config->global,
              "garbage at end of field specification: %s\n", contp);
      }
    }

    /* Set part name. */
    if(name && curl_mime_name(part, name)) {
      warnf(config->global, "curl_mime_name failed!\n");
      Curl_safefree(contents);
      return 31;
    }
  }
  else {
    warnf(config->global, "Illegally formatted input field!\n");
    Curl_safefree(contents);
    return 32;
  }
  Curl_safefree(contents);
  return 0;
}